

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_map.cpp
# Opt level: O0

void Rotate(CPoint *pCenter,CPoint *pPoint,float Rotation)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *in_RSI;
  int *in_RDI;
  float in_XMM0_Da;
  float fVar5;
  float fVar6;
  int y;
  int x;
  
  iVar1 = *in_RSI;
  iVar2 = *in_RDI;
  iVar3 = in_RSI[1];
  iVar4 = in_RDI[1];
  fVar5 = cosf(in_XMM0_Da);
  fVar6 = sinf(in_XMM0_Da);
  *in_RSI = (int)((float)(iVar1 - iVar2) * fVar5 + -((float)(iVar3 - iVar4) * fVar6) +
                 (float)*in_RDI);
  fVar5 = sinf(in_XMM0_Da);
  fVar6 = cosf(in_XMM0_Da);
  in_RSI[1] = (int)((float)(iVar1 - iVar2) * fVar5 + (float)(iVar3 - iVar4) * fVar6 +
                   (float)in_RDI[1]);
  return;
}

Assistant:

static void Rotate(const CPoint *pCenter, CPoint *pPoint, float Rotation)
{
	int x = pPoint->x - pCenter->x;
	int y = pPoint->y - pCenter->y;
	pPoint->x = (int)(x * cosf(Rotation) - y * sinf(Rotation) + pCenter->x);
	pPoint->y = (int)(x * sinf(Rotation) + y * cosf(Rotation) + pCenter->y);
}